

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableSetColumnWidth(int column_n,float width)

{
  float fVar1;
  float fVar2;
  char cVar3;
  ImGuiTable *table;
  ImGuiTableColumn *pIVar4;
  ImGuiTableColumn *pIVar5;
  ImGuiContext *g;
  ImGuiTableColumn *pIVar6;
  uint uVar7;
  float fVar8;
  undefined1 auVar9 [12];
  float fVar10;
  
  table = GImGui->CurrentTable;
  if ((table == (ImGuiTable *)0x0) || (table->IsLayoutLocked != false)) {
    __assert_fail("table != __null && table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x25e7,"void ImGui::TableSetColumnWidth(int, float)");
  }
  if ((column_n < 0) || (table->ColumnsCount <= column_n)) {
    __assert_fail("column_n >= 0 && column_n < table->ColumnsCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x25e8,"void ImGui::TableSetColumnWidth(int, float)");
  }
  pIVar5 = (table->Columns).Data;
  pIVar4 = (table->Columns).DataEnd;
  pIVar6 = pIVar5 + (uint)column_n;
  if (pIVar6 < pIVar4) {
    fVar10 = (GImGui->Style).FramePadding.x;
    if ((table->Flags & 0x2000000) == 0) {
      auVar9._4_8_ = 0;
      auVar9._0_4_ = ((table->WorkRect).Max.x - pIVar6->MinX) -
                     (float)(~(int)pIVar6->IndexWithinVisibleSet + (int)table->ColumnsVisibleCount)
                     * fVar10;
    }
    else {
      auVar9 = ZEXT812(0x7f7fffff);
    }
    if (width <= auVar9._0_4_) {
      auVar9._4_8_ = auVar9._4_8_;
      auVar9._0_4_ = width;
    }
    fVar8 = (float)(-(uint)(width < fVar10) & (uint)fVar10 | ~-(uint)(width < fVar10) & auVar9._0_4_
                   );
    if ((pIVar6->WidthGiven != fVar8) || (NAN(pIVar6->WidthGiven) || NAN(fVar8))) {
      fVar1 = pIVar6->WidthRequest;
      if ((fVar1 != fVar8) || (NAN(fVar1) || NAN(fVar8))) {
        cVar3 = pIVar6->NextVisibleColumn;
        if ((long)cVar3 == -1) {
          pIVar5 = (ImGuiTableColumn *)0x0;
        }
        else if ((cVar3 < '\0') || (pIVar5 = pIVar5 + cVar3, pIVar4 <= pIVar5)) goto LAB_002c0c50;
        table->IsSettingsDirty = true;
        if ((pIVar6->Flags & 8U) == 0) {
          if ((pIVar6->Flags & 4U) != 0) {
            if (pIVar5 == (ImGuiTableColumn *)0x0) {
              if (pIVar6->PrevVisibleColumn == -1) {
                pIVar5 = (ImGuiTableColumn *)0x0;
              }
              else {
                pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                                   (&table->Columns,(int)pIVar6->PrevVisibleColumn);
              }
            }
            if (pIVar5 != (ImGuiTableColumn *)0x0) {
              if ((pIVar5->Flags & 8) == 0) {
                fVar1 = pIVar5->WidthRequest;
                fVar2 = pIVar6->WidthRequest;
                fVar8 = fVar1 - (fVar8 - fVar2);
                uVar7 = -(uint)(fVar10 <= fVar8);
                fVar10 = (float)(~uVar7 & (uint)fVar10 | (uint)fVar8 & uVar7);
                pIVar5->WidthRequest = fVar10;
                pIVar6->WidthRequest = (fVar1 + fVar2) - fVar10;
                TableUpdateColumnsWeightFromWidth(table);
                return;
              }
              fVar8 = (pIVar6->WidthGiven - fVar8) + pIVar5->WidthGiven;
              uVar7 = -(uint)(fVar8 <= fVar10);
              pIVar5->WidthRequest = (float)(uVar7 & (uint)fVar10 | ~uVar7 & (uint)fVar8);
            }
          }
        }
        else {
          if ((((pIVar5 != (ImGuiTableColumn *)0x0) && ((pIVar5->Flags & 8) != 0)) &&
              (table->LeftMostStretchedColumnDisplayOrder != -1)) &&
             (table->LeftMostStretchedColumnDisplayOrder < pIVar6->DisplayOrder)) {
            fVar8 = pIVar5->WidthRequest - (fVar8 - fVar1);
            uVar7 = -(uint)(fVar10 <= fVar8);
            fVar10 = (float)(~uVar7 & (uint)fVar10 | (uint)fVar8 & uVar7);
            fVar8 = (fVar1 + pIVar5->WidthRequest) - fVar10;
            pIVar5->WidthRequest = fVar10;
          }
          pIVar6->WidthRequest = fVar8;
        }
      }
    }
    return;
  }
LAB_002c0c50:
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_internal.h"
                ,0x217,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
}

Assistant:

void ImGui::TableSetColumnWidth(int column_n, float width)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && table->IsLayoutLocked == false);
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column_0 = &table->Columns[column_n];
    float column_0_width = width;

    // Constraints
    const float min_width = TableGetMinColumnWidth();
    float max_width_0 = FLT_MAX;
    if (!(table->Flags & ImGuiTableFlags_ScrollX))
        max_width_0 = (table->WorkRect.Max.x - column_0->MinX) - (table->ColumnsVisibleCount - (column_0->IndexWithinVisibleSet + 1)) * min_width;
    column_0_width = ImClamp(column_0_width, min_width, max_width_0);

    // Compare both requested and actual given width to avoid overwriting requested width when column is stuck (minimum size, bounded)
    if (column_0->WidthGiven == column_0_width || column_0->WidthRequest == column_0_width)
        return;

    ImGuiTableColumn* column_1 = (column_0->NextVisibleColumn != -1) ? &table->Columns[column_0->NextVisibleColumn] : NULL;

    // In this surprisingly not simple because of how we support mixing Fixed and Stretch columns.
    // When forwarding resize from Wn| to Fn+1| we need to be considerate of the _NoResize flag on Fn+1.
    // FIXME-TABLE: Find a way to rewrite all of this so interactions feel more consistent for the user.
    // Scenarios:
    // - F1 F2 F3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. Subsequent columns will be offset.
    // - F1 F2 F3  resize from F3|          --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered.
    // - F1 F2 W3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered, but it doesn't make much sense as the Stretch column will always be minimal size.
    // - F1 F2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 W3  resize from W1| or W2|   --> FIXME
    // - W1 W2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2 F3  resize from F3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2     resize from F2|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 F3  resize from W1| or W2|   --> ok
    // - W1 F2 W3  resize from W1| or F2|   --> FIXME
    // - F1 W2 F3  resize from W2|          --> ok
    // - W1 F2 F3  resize from W1|          --> ok: equivalent to resizing |F2. F3 will not move. (forwarded by Resize Rule 2)
    // - W1 F2 F3  resize from F2|          --> FIXME should resize F2, F3 and not have effect on W1 (Stretch columns are _before_ the Fixed column).

    // Rules:
    // - [Resize Rule 1] Can't resize from right of right-most visible column if there is any Stretch column. Implemented in TableUpdateLayout().
    // - [Resize Rule 2] Resizing from right-side of a Stretch column before a fixed column forward sizing to left-side of fixed column.
    // - [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure that our left border won't move.
    table->IsSettingsDirty = true;
    if (column_0->Flags & ImGuiTableColumnFlags_WidthFixed)
    {
        // [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure
        // that our left border won't move, which we can do by making sure column_a/column_b resizes cancels each others.
        if (column_1 && (column_1->Flags & ImGuiTableColumnFlags_WidthFixed))
            if (table->LeftMostStretchedColumnDisplayOrder != -1 && table->LeftMostStretchedColumnDisplayOrder < column_0->DisplayOrder)
            {
                // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
                float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
                column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
                column_1->WidthRequest = column_1_width;
            }

        // Apply
        //IMGUI_DEBUG_LOG("TableSetColumnWidth(%d, %.1f->%.1f)\n", column_0_idx, column_0->WidthRequested, column_0_width);
        column_0->WidthRequest = column_0_width;
    }
    else if (column_0->Flags & ImGuiTableColumnFlags_WidthStretch)
    {
        // We can also use previous column if there's no next one
        if (column_1 == NULL)
            column_1 = (column_0->PrevVisibleColumn != -1) ? &table->Columns[column_0->PrevVisibleColumn] : NULL;
        if (column_1 == NULL)
            return;

        if (column_1->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // [Resize Rule 2]
            float off = (column_0->WidthGiven - column_0_width);
            float column_1_width = column_1->WidthGiven + off;
            column_1->WidthRequest = ImMax(min_width, column_1_width);
        }
        else
        {
            // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
            float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
            column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
            column_1->WidthRequest = column_1_width;
            column_0->WidthRequest = column_0_width;
            TableUpdateColumnsWeightFromWidth(table);
        }
    }
}